

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O3

void __thiscall QSslSocket::resume(QSslSocket *this)

{
  long in_FS_OFFSET;
  void *local_28;
  char *pcStack_20;
  QMetaTypeInterface *local_18 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(char *)(*(long *)&(this->super_QTcpSocket).super_QAbstractSocket.field_0x8 + 0x400) ==
      '\x01') {
    local_28 = (void *)0x0;
    pcStack_20 = (char *)0x0;
    local_18[0] = (QMetaTypeInterface *)0x0;
    QMetaObject::invokeMethodImpl
              ((QObject *)this,"_q_resumeImplementation",QueuedConnection,1,&local_28,&pcStack_20,
               local_18);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSslSocket::resume()
{
    Q_D(QSslSocket);
    if (!d->paused)
        return;
    // continuing might emit signals, rather do this through the event loop
    QMetaObject::invokeMethod(this, "_q_resumeImplementation", Qt::QueuedConnection);
}